

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNonDsd.c
# Opt level: O3

void Dau_DecTrySets(word *pInit,int nVars,int fVerbose)

{
  uint uVar1;
  uint set;
  Vec_Int_t *__ptr;
  ulong uVar2;
  uint uSet;
  int *__ptr_00;
  
  if (0x10 < nVars) {
    __assert_fail("nVars <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/dau/dauNonDsd.c"
                  ,0x343,"void Dau_DecTrySets(word *, int, int)");
  }
  __ptr = Dau_DecFindSets(pInit,nVars);
  if (fVerbose == 0) {
    __ptr_00 = __ptr->pArray;
LAB_004ef30f:
    if (__ptr_00 == (int *)0x0) goto LAB_004ef31c;
  }
  else {
    Dau_DsdPrintFromTruth(pInit,nVars);
    uVar1 = __ptr->nSize;
    printf("This %d-variable function has %d decomposable variable sets:\n",(ulong)(uint)nVars,
           (ulong)uVar1);
    __ptr_00 = __ptr->pArray;
    if ((long)(int)uVar1 < 1) goto LAB_004ef30f;
    uVar2 = 0;
    do {
      set = __ptr_00[uVar2];
      printf("Set %4d : ",uVar2 & 0xffffffff);
      if (nVars < 7) {
        Dau_DecPrintSet(set,nVars,1);
        Dau_DecPerform6(pInit,nVars,set);
      }
      else {
        Dau_DecPrintSet(set,nVars,0);
        Dau_DecPerform(pInit,nVars,set);
      }
      uVar2 = uVar2 + 1;
    } while ((long)(int)uVar1 != uVar2);
  }
  free(__ptr_00);
LAB_004ef31c:
  free(__ptr);
  return;
}

Assistant:

void Dau_DecTrySets( word * pInit, int nVars, int fVerbose )
{
    Vec_Int_t * vSets;
    int i, Entry;
    assert( nVars <= 16 );
    vSets = Dau_DecFindSets( pInit, nVars );
    if ( !fVerbose )
    {
        Vec_IntFree( vSets );
        return;
    }
    Dau_DsdPrintFromTruth( pInit, nVars ); 
    printf( "This %d-variable function has %d decomposable variable sets:\n", nVars, Vec_IntSize(vSets) );
    Vec_IntForEachEntry( vSets, Entry, i )
    {
        unsigned uSet = (unsigned)Entry;
        printf( "Set %4d : ", i );
        if ( nVars > 6 )
        {
            Dau_DecPrintSet( uSet, nVars, 0 );
            Dau_DecPerform( pInit, nVars, uSet );
        }
        else
        {
            Dau_DecPrintSet( uSet, nVars, 1 );
            Dau_DecPerform6( pInit, nVars, uSet );
        }
    }
    Vec_IntFree( vSets );
//    printf( "\n" );
}